

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O3

bool __thiscall
irr::scene::COBJMeshFileLoader::retrieveVertexIndices
          (COBJMeshFileLoader *this,c8 *vertexData,s32 *idx,c8 *bufEnd,u32 vbsize,u32 vtsize,
          u32 vnsize)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  s32 sVar11;
  bool bVar12;
  bool bVar13;
  byte local_48 [24];
  
  pbVar3 = (byte *)vertexData;
  if (vertexData != bufEnd) {
    do {
      vertexData = (c8 *)pbVar3;
      if ((4 < (byte)*vertexData - 9) && (*vertexData != 0x20)) break;
      pbVar3 = (byte *)vertexData + 1;
      vertexData = bufEnd;
    } while (pbVar3 != (byte *)bufEnd);
  }
  if (vertexData == bufEnd) {
LAB_001b44bb:
    bVar12 = true;
  }
  else {
    uVar2 = 0;
    uVar7 = 0;
    do {
      bVar12 = uVar2 < 0x10;
      if (!bVar12) {
        return false;
      }
      bVar8 = *vertexData;
      if ((int)(char)bVar8 - 0x30U < 10) {
LAB_001b4331:
        uVar9 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
        local_48[uVar9] = bVar8;
      }
      else if (bVar8 < 0x2d) {
        if ((bVar8 == 0) || (bVar8 == 0x20)) {
LAB_001b436a:
          local_48[uVar2] = 0;
          uVar9 = (ulong)((local_48[0] - 0x2b & 0xfd) == 0);
          bVar8 = local_48[uVar9];
          iVar6 = (int)uVar7;
          if ((byte)(bVar8 - 0x30) < 10) {
            pbVar3 = local_48 + uVar9 + 1;
            uVar5 = 0;
            bVar4 = false;
            do {
              uVar1 = (uint)(byte)(bVar8 - 0x30) + uVar5 * 10;
              uVar2 = uVar1;
              if (bVar4) {
                uVar2 = uVar5;
              }
              bVar13 = uVar1 < uVar5;
              uVar5 = uVar2;
              if (bVar13) {
                uVar5 = 0xffffffff;
              }
              bVar4 = (bool)(bVar4 | bVar13);
              bVar8 = *pbVar3;
              pbVar3 = pbVar3 + 1;
            } while ((byte)(bVar8 - 0x30) < 10);
            if ((int)uVar5 < 0) {
              uVar2 = 0x7fffffff;
              if (local_48[0] != 0x2d) goto LAB_001b444e;
              idx[uVar7] = -0x80000000;
              iVar10 = -0x80000000;
            }
            else {
              if (local_48[0] != 0x2d) {
LAB_001b444e:
                idx[uVar7] = uVar2;
                sVar11 = uVar2 - 1;
                goto LAB_001b445a;
              }
              iVar10 = -uVar2;
              idx[uVar7] = iVar10;
              if ((int)uVar2 < 1) goto LAB_001b4412;
            }
            if (iVar6 == 2) {
              sVar11 = iVar10 + vnsize;
            }
            else if (iVar6 == 1) {
              sVar11 = iVar10 + vtsize;
            }
            else {
              if (iVar6 != 0) goto LAB_001b445d;
              sVar11 = iVar10 + vbsize;
            }
            idx[uVar7] = sVar11;
          }
          else {
            uVar2 = 0;
            if (local_48[0] != 0x2d) goto LAB_001b444e;
            idx[uVar7] = 0;
LAB_001b4412:
            sVar11 = -1;
LAB_001b445a:
            idx[uVar7] = sVar11;
          }
LAB_001b445d:
          local_48[0] = 0;
          uVar5 = iVar6 + 1;
          if (*vertexData != 0x2f) {
            if (uVar5 < 3) {
              memset(idx + uVar5,0xff,(ulong)(1 - iVar6) * 4 + 4);
            }
            goto LAB_001b44bb;
          }
          uVar2 = 0;
          if (2 < uVar5) {
            uVar5 = 0;
          }
          uVar7 = (ulong)uVar5;
        }
      }
      else {
        if (bVar8 == 0x2f) goto LAB_001b436a;
        if (bVar8 == 0x2d) goto LAB_001b4331;
      }
      vertexData = (c8 *)((byte *)vertexData + 1);
    } while (vertexData != bufEnd);
  }
  return bVar12;
}

Assistant:

const c8 *COBJMeshFileLoader::goFirstWord(const c8 *buf, const c8 *const bufEnd, bool acrossNewlines)
{
	// skip space characters
	if (acrossNewlines)
		while ((buf != bufEnd) && core::isspace(*buf))
			++buf;
	else
		while ((buf != bufEnd) && core::isspace(*buf) && (*buf != '\n'))
			++buf;

	return buf;
}